

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::
BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
          (DrawIndirectBase *this,GLuint expectedValue)

{
  ostringstream *poVar1;
  long lVar2;
  GLboolean value;
  GLboolean extraout_DL;
  GLboolean extraout_DL_00;
  GLboolean extraout_DL_01;
  GLboolean value_00;
  CallLogWrapper *this_00;
  GLboolean valueBool;
  GLint valueInt;
  GLfloat valueFloat;
  DIResult status;
  byte local_375;
  GLuint local_374;
  string local_370;
  string local_350;
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  long local_30;
  
  local_1b0[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  local_30 = 0;
  local_374 = 0xffffd8f1;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f43,(GLint *)&local_374);
  if (local_374 != expectedValue) {
    local_30 = -1;
    poVar1 = (ostringstream *)(local_330 + 8);
    local_330[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_330,
               (char (*) [72])
               "glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    if (local_330[0] == (DILogger)0x0) {
      std::ostream::operator<<(poVar1,local_374);
    }
    if (((byte)local_330[0] & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    }
    if (((byte)local_330[0] & 1) == 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    DILogger::~DILogger((DILogger *)local_330);
  }
  local_375 = expectedValue == 0;
  glu::CallLogWrapper::glGetBooleanv(this_00,0x8f43,&local_375);
  if ((bool)local_375 != (expectedValue != 0)) {
    local_30 = -1;
    poVar1 = (ostringstream *)(local_330 + 8);
    local_330[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_330,
               (char (*) [72])
               "glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_370,(DrawIndirectBase *)(ulong)local_375,value);
    value_00 = extraout_DL;
    if (local_330[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 (char *)CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_)
                 ,local_370._M_string_length);
      value_00 = extraout_DL_00;
    }
    if (((byte)local_330[0] & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      value_00 = extraout_DL_01;
    }
    glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
              (&local_350,(DrawIndirectBase *)(ulong)(expectedValue != 0),value_00);
    if (local_330[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_350._M_dataplus._M_p,local_350._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_) !=
        &local_370.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_370._M_dataplus._M_p._4_4_,local_370._M_dataplus._M_p._0_4_),
                      local_370.field_2._M_allocated_capacity + 1);
    }
    DILogger::~DILogger((DILogger *)local_330);
  }
  local_370._M_dataplus._M_p._0_4_ = -9999.0;
  glu::CallLogWrapper::glGetFloatv(this_00,0x8f43,(GLfloat *)&local_370);
  if ((local_370._M_dataplus._M_p._0_4_ != (float)expectedValue) ||
     (NAN(local_370._M_dataplus._M_p._0_4_) || NAN((float)expectedValue))) {
    local_30 = -1;
    poVar1 = (ostringstream *)(local_330 + 8);
    local_330[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_330,
               (char (*) [70])
               "glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: ");
    if (local_330[0] == (DILogger)0x0) {
      std::ostream::_M_insert<double>((double)local_370._M_dataplus._M_p._0_4_);
    }
    if (((byte)local_330[0] & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    }
    if (((byte)local_330[0] & 1) == 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    DILogger::~DILogger((DILogger *)local_330);
  }
  lVar2 = local_30;
  DILogger::~DILogger((DILogger *)local_1b0);
  return lVar2;
}

Assistant:

long BindingPointCheck(GLuint expectedValue)
	{
		DIResult status;

		GLint valueInt = -9999;
		glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueInt);
		if (valueInt != static_cast<GLint>(expectedValue))
		{
			status.error() << "glGetIntegerv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: " << valueInt
						   << ", expected: " << expectedValue;
		}

		GLboolean valueBool = expectedValue ? GL_FALSE : GL_TRUE;
		glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueBool);
		if (valueBool != (expectedValue ? GL_TRUE : GL_FALSE))
		{
			status.error() << "glGetBooleanv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
						   << BoolToString(valueBool)
						   << ", expected: " << BoolToString(expectedValue ? GL_TRUE : GL_FALSE);
		}

		GLfloat valueFloat		   = -9999;
		GLfloat expectedFloatValue = static_cast<GLfloat>(expectedValue);
		glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueFloat);
		if (valueFloat != expectedFloatValue)
		{
			status.error() << "glGetFloatv(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: " << valueFloat
						   << ", expected: " << expectedValue;
		}

		if (!api::isES())
		{
			GLdouble valueDouble = -9999;
			glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING, &valueDouble);
			if (valueDouble != static_cast<GLdouble>(expectedValue))
			{
				status.error() << "glGetDoublev(GL_DRAW_INDIRECT_BUFFER_BINDING) returned invalid value: "
							   << valueDouble << ", expected: " << expectedValue;
			}
		}

		return status.code();
	}